

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_sub_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  fVar5 = c->in[1].m_data[0];
  fVar6 = c->in[1].m_data[1];
  fVar7 = c->in[1].m_data[2];
  fVar8 = c->in[1].m_data[3];
  uVar9 = (uint)fVar1;
  uVar11 = (uint)fVar2;
  uVar13 = (uint)fVar3;
  uVar15 = (uint)fVar4;
  uVar10 = (uint)fVar5;
  uVar12 = (uint)fVar6;
  uVar14 = (uint)fVar7;
  uVar16 = (uint)fVar8;
  uVar11 = ((int)uVar11 >> 0x1f & (int)(fVar2 - 2.1474836e+09) | uVar11) -
           ((int)uVar16 >> 0x1f & (int)(fVar8 - 2.1474836e+09) | uVar16);
  uVar13 = ((int)uVar13 >> 0x1f & (int)(fVar3 - 2.1474836e+09) | uVar13) -
           ((int)uVar14 >> 0x1f & (int)(fVar7 - 2.1474836e+09) | uVar14);
  uVar12 = ((int)uVar15 >> 0x1f & (int)(fVar4 - 2.1474836e+09) | uVar15) -
           ((int)uVar12 >> 0x1f & (int)(fVar6 - 2.1474836e+09) | uVar12);
  uVar9 = ((int)uVar9 >> 0x1f & (int)(fVar1 - 2.1474836e+09) | uVar9) -
          ((int)uVar10 >> 0x1f & (int)(fVar5 - 2.1474836e+09) | uVar10);
  (c->color).m_data[0] =
       ((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar11 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[1] =
       ((float)(uVar13 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar13 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[2] =
       ((float)(uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar12 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[3] =
       ((float)(uVar9 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar9 & 0xffff | 0x4b000000);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }